

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
ElementsTransactionApi_EstimateFee_CheckRealValue_Test::TestBody
          (ElementsTransactionApi_EstimateFee_CheckRealValue_Test *this)

{
  initializer_list<cfd::UtxoData> __l;
  initializer_list<cfd::api::ElementsUtxoAndOption> __l_00;
  bool bVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  size_type sVar5;
  long lVar6;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  Amount *expected_predicate_value;
  AssertionResult gtest_ar_6;
  uint32_t minimum_fee;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  CfdException *anon_var_0_1;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  ByteData tx;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_3;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  txouts;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ct_addrs;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ElementsTransactionApi api;
  Amount tx_fee;
  Amount utxo_fee;
  Amount calc_fee;
  double effective_fee_rate;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  utxos_and_options;
  ElementsUtxoAndOption eutxo3;
  ElementsUtxoAndOption eutxo2;
  ElementsUtxoAndOption eutxo1;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ConfidentialTransactionContext txc;
  Amount fee;
  ElementsConfidentialAddress asset_address;
  ElementsConfidentialAddress address;
  UtxoData utxo3;
  UtxoData utxo2;
  UtxoData utxo1;
  ElementsAddressFactory factory;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffa93c;
  undefined4 in_stack_ffffffffffffa940;
  undefined4 uVar8;
  undefined4 in_stack_ffffffffffffa944;
  undefined4 uVar9;
  undefined4 in_stack_ffffffffffffa94c;
  ElementsUtxoAndOption *in_stack_ffffffffffffa950;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  *this_00;
  ElementsUtxoAndOption *in_stack_ffffffffffffa958;
  ElementsUtxoAndOption *in_stack_ffffffffffffa960;
  undefined4 in_stack_ffffffffffffa968;
  undefined4 in_stack_ffffffffffffa96c;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffa970;
  undefined4 in_stack_ffffffffffffa978;
  undefined4 in_stack_ffffffffffffa97c;
  undefined4 in_stack_ffffffffffffa980;
  undefined4 in_stack_ffffffffffffa984;
  undefined1 ***local_5548;
  UtxoData *local_54f8;
  AssertHelper local_5438;
  Message local_5430;
  undefined4 local_5424;
  AssertionResult local_5420;
  int local_540c;
  AssertHelper local_5408;
  Message local_5400;
  undefined4 local_53f8;
  undefined4 local_53f4;
  AssertionResult local_53f0;
  AssertHelper local_53e0;
  Message local_53d8;
  undefined4 local_53cc;
  undefined8 local_53c8;
  AssertionResult local_53c0;
  AssertHelper local_53b0;
  Message local_53a8 [4];
  AssertHelper local_5388;
  Message local_5380;
  OutPoint local_5378;
  AssertHelper local_5350;
  Message local_5348;
  SigHashType local_5340 [15];
  allocator local_5331;
  string local_5330 [32];
  string local_5310 [39];
  allocator local_52e9;
  string local_52e8 [32];
  Pubkey local_52c8;
  OutPoint local_52b0;
  AssertHelper local_5288;
  Message local_5280 [5];
  byte local_5251;
  ConstCharPtr local_5250;
  AssertHelper local_5248;
  Message local_5240;
  OutPoint local_5238;
  AssertHelper local_5210;
  Message local_5208;
  SigHashType local_5200 [15];
  allocator local_51f1;
  string local_51f0 [32];
  string local_51d0 [39];
  allocator local_51a9;
  string local_51a8 [32];
  Pubkey local_5188;
  OutPoint local_5170;
  AssertHelper local_5148;
  Message local_5140 [5];
  byte local_5111;
  ConstCharPtr local_5110;
  AssertHelper local_5108;
  Message local_5100;
  OutPoint local_50f8;
  AssertHelper local_50d0;
  Message local_50c8;
  SigHashType local_50c0 [15];
  allocator local_50b1;
  string local_50b0 [32];
  string local_5090 [39];
  allocator local_5069;
  string local_5068 [32];
  Pubkey local_5048;
  OutPoint local_5030;
  ByteData local_5008;
  string local_4ff0;
  AssertHelper local_4fd0;
  Message local_4fc8 [6];
  byte local_4f91;
  AssertionResult local_4f90;
  string local_4f80;
  AssertHelper local_4f60;
  Message local_4f58 [6];
  byte local_4f21;
  AssertionResult local_4f20;
  string local_4f10;
  AssertHelper local_4ef0;
  Message local_4ee8 [6];
  byte local_4eb1;
  AssertionResult local_4eb0;
  AssertHelper local_4ea0;
  Message local_4e98;
  undefined4 local_4e8c;
  size_type local_4e88;
  AssertionResult local_4e80;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  local_4e70 [24];
  AssertHelper local_4e58;
  Message local_4e50;
  undefined1 local_4e48 [24];
  AssertHelper local_4e30;
  Message local_4e28;
  undefined4 local_4e1c;
  undefined8 local_4e18;
  AssertionResult local_4e10;
  AssertHelper local_4e00;
  Message local_4df8;
  undefined4 local_4dec;
  undefined8 local_4de8;
  AssertionResult local_4de0;
  AssertHelper local_4dd0;
  Message local_4dc8;
  undefined4 local_4dbc;
  undefined8 local_4db8;
  AssertionResult local_4db0;
  undefined8 local_4da0;
  undefined1 local_4d98;
  vector local_4d90 [32];
  undefined8 local_4d70;
  undefined1 local_4d68;
  ElementsTransactionApi local_4d59;
  Amount local_4d58 [16];
  Amount local_4d48 [16];
  undefined8 local_4d38;
  undefined1 local_4d30;
  double local_4d28;
  undefined8 **local_4d18;
  undefined1 **local_4d10 [167];
  undefined1 local_47d8 [1336];
  undefined1 local_42a0 [1336];
  undefined8 **local_3d68;
  undefined8 local_3d60;
  undefined1 local_3d58 [1360];
  UtxoData local_3808 [1336];
  UtxoData local_32d0 [1336];
  AssertHelper local_2d98;
  Message local_2d90 [2];
  UtxoData *local_2d80;
  UtxoData local_2d78 [1264];
  UtxoData local_2888 [1264];
  UtxoData local_2398 [1264];
  UtxoData *local_1ea8;
  undefined8 local_1ea0;
  Amount local_1e80 [376];
  _func_int **local_1d08;
  undefined1 local_1d00;
  undefined8 local_1cf8;
  undefined1 local_1cf0;
  undefined8 local_1ce8;
  undefined1 local_1ce0;
  undefined1 local_1cd8 [56];
  OutPoint local_1ca0;
  AssertHelper local_1c78;
  Message local_1c70 [2];
  OutPoint local_1c60 [4];
  undefined1 local_1ba8 [24];
  string local_1b90 [32];
  ElementsConfidentialAddress local_1b70 [439];
  allocator local_19b9;
  string local_19b8 [32];
  ElementsConfidentialAddress local_1998 [439];
  allocator local_17e1;
  string local_17e0 [32];
  ConfidentialAssetId local_17c0;
  undefined8 local_1798;
  undefined1 local_1790;
  allocator local_1781;
  string local_1780 [32];
  string local_1760 [383];
  allocator local_15e1;
  string local_15e0 [32];
  Script local_15c0;
  allocator local_1581;
  string local_1580 [32];
  Txid local_1560;
  undefined8 local_1540 [5];
  Txid local_1518;
  uint local_14f8;
  Script local_14f0 [2];
  Address local_1480 [376];
  string local_1308 [32];
  undefined8 local_12e8;
  undefined1 local_12e0;
  undefined4 local_12d8;
  undefined8 local_12d0;
  ConfidentialAssetId local_12c8 [15];
  allocator local_1049;
  string local_1048 [32];
  ConfidentialValue local_1028;
  allocator local_ff9;
  string local_ff8 [32];
  BlindFactor local_fd8;
  allocator local_fb1;
  string local_fb0 [32];
  BlindFactor local_f90;
  allocator local_f69;
  string local_f68 [32];
  ConfidentialAssetId local_f48;
  _func_int **local_f20;
  undefined1 local_f18;
  allocator local_f09;
  string local_f08 [32];
  string local_ee8 [383];
  allocator local_d69;
  string local_d68 [32];
  Script local_d48;
  allocator local_d09;
  string local_d08 [32];
  Txid local_ce8;
  undefined8 local_cc8 [5];
  Txid local_ca0;
  uint local_c80;
  Script local_c78 [2];
  Address local_c08 [376];
  string local_a90 [32];
  undefined1 local_a70 [504];
  BlindFactor local_878;
  BlindFactor local_858;
  ConfidentialValue local_838 [2];
  allocator local_7d1;
  string local_7d0 [32];
  ConfidentialAssetId local_7b0;
  undefined8 local_788;
  undefined1 local_780;
  allocator local_771;
  string local_770 [32];
  string local_750 [383];
  allocator local_5d1;
  string local_5d0 [32];
  Script local_5b0;
  allocator local_571;
  string local_570 [32];
  Txid local_550;
  undefined8 local_520 [5];
  Txid local_4f8;
  uint local_4d8;
  Script local_4d0 [2];
  Address local_460 [376];
  string local_2e8 [32];
  undefined8 local_2c8;
  undefined1 local_2c0;
  undefined4 local_2b8;
  undefined8 local_2b0;
  ConfidentialAssetId local_2a8 [15];
  ElementsAddressFactory local_30 [48];
  
  cfd::ElementsAddressFactory::ElementsAddressFactory(local_30,kElementsRegtest);
  cfd::UtxoData::UtxoData((UtxoData *)local_520);
  local_520[0] = 0;
  local_2b0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_570,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",&local_571
            );
  cfd::core::Txid::Txid(&local_550,local_570);
  cfd::core::Txid::operator=(&local_4f8,&local_550);
  cfd::core::Txid::~Txid((Txid *)0x27bf06);
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  local_4d8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_5d0,"76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac",&local_5d1);
  cfd::core::Script::Script(&local_5b0,local_5d0);
  cfd::core::Script::operator=(local_4d0,&local_5b0);
  cfd::core::Script::~Script
            ((Script *)CONCAT44(in_stack_ffffffffffffa944,in_stack_ffffffffffffa940));
  std::__cxx11::string::~string(local_5d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_770,"2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph",&local_771);
  cfd::AddressFactory::GetAddress(local_750);
  cfd::core::Address::operator=(local_460,(Address *)local_750);
  cfd::core::Address::~Address
            ((Address *)CONCAT44(in_stack_ffffffffffffa944,in_stack_ffffffffffffa940));
  std::__cxx11::string::~string(local_770);
  std::allocator<char>::~allocator((allocator<char> *)&local_771);
  std::__cxx11::string::operator=
            (local_2e8,"pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)");
  cfd::core::Amount::Amount((Amount *)&local_788,10000000);
  local_2c0 = local_780;
  local_2c8 = local_788;
  local_2b8 = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_7d0,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",&local_7d1
            );
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_7b0,local_7d0);
  cfd::core::ConfidentialAssetId::operator=(local_2a8,&local_7b0);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x27c104);
  std::__cxx11::string::~string(local_7d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
  cfd::UtxoData::UtxoData((UtxoData *)local_cc8);
  local_cc8[0] = 0;
  local_a70._24_8_ = (pointer)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d08,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3",&local_d09
            );
  cfd::core::Txid::Txid(&local_ce8,local_d08);
  cfd::core::Txid::operator=(&local_ca0,&local_ce8);
  cfd::core::Txid::~Txid((Txid *)0x27c1b3);
  std::__cxx11::string::~string(local_d08);
  std::allocator<char>::~allocator((allocator<char> *)&local_d09);
  local_c80 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d68,"a9145d54db96a28f844a744e393fcd699d6f825b284187",&local_d69);
  cfd::core::Script::Script(&local_d48,local_d68);
  cfd::core::Script::operator=(local_c78,&local_d48);
  cfd::core::Script::~Script
            ((Script *)CONCAT44(in_stack_ffffffffffffa944,in_stack_ffffffffffffa940));
  std::__cxx11::string::~string(local_d68);
  std::allocator<char>::~allocator((allocator<char> *)&local_d69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f08,"XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE",&local_f09);
  cfd::AddressFactory::GetAddress(local_ee8);
  cfd::core::Address::operator=(local_c08,(Address *)local_ee8);
  cfd::core::Address::~Address
            ((Address *)CONCAT44(in_stack_ffffffffffffa944,in_stack_ffffffffffffa940));
  std::__cxx11::string::~string(local_f08);
  std::allocator<char>::~allocator((allocator<char> *)&local_f09);
  std::__cxx11::string::operator=
            (local_a90,
             "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))");
  cfd::core::Amount::Amount((Amount *)&local_f20,180000);
  local_a70[8] = local_f18;
  local_a70._0_8_ = local_f20;
  local_a70._16_4_ = 6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_f68,"849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735",&local_f69
            );
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_f48,local_f68);
  cfd::core::ConfidentialAssetId::operator=((ConfidentialAssetId *)(local_a70 + 0x20),&local_f48);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x27c3b1);
  std::__cxx11::string::~string(local_f68);
  std::allocator<char>::~allocator((allocator<char> *)&local_f69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_fb0,"23b44363de1069842dff58ac6c965f75af71949e58d823d7bfcc963134db0b3e",&local_fb1
            );
  cfd::core::BlindFactor::BlindFactor(&local_f90,local_fb0);
  cfd::core::BlindFactor::operator=(&local_878,&local_f90);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x27c439);
  std::__cxx11::string::~string(local_fb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_fb1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_ff8,"6dfe8c49f10c40cac178da4056dbf55eb11fa26e3169f41019e88252d86c42bc",&local_ff9
            );
  cfd::core::BlindFactor::BlindFactor(&local_fd8,local_ff8);
  cfd::core::BlindFactor::operator=(&local_858,&local_fd8);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x27c4c1);
  std::__cxx11::string::~string(local_ff8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ff9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1048,"09da970d871982c2405b2d4bff4f455e4907bedaf95c205f94015809f6bd9c59fa",
             &local_1049);
  cfd::core::ConfidentialValue::ConfidentialValue(&local_1028,local_1048);
  cfd::core::ConfidentialValue::operator=(local_838,&local_1028);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x27c549);
  std::__cxx11::string::~string(local_1048);
  std::allocator<char>::~allocator((allocator<char> *)&local_1049);
  cfd::UtxoData::UtxoData((UtxoData *)local_1540);
  local_1540[0] = 0;
  local_12d0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1580,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",
             &local_1581);
  cfd::core::Txid::Txid(&local_1560,local_1580);
  cfd::core::Txid::operator=(&local_1518,&local_1560);
  cfd::core::Txid::~Txid((Txid *)0x27c5f8);
  std::__cxx11::string::~string(local_1580);
  std::allocator<char>::~allocator((allocator<char> *)&local_1581);
  local_14f8 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_15e0,"0014f330ed8383f8afdc977dd88600eb8ff120ba15e4",&local_15e1);
  cfd::core::Script::Script(&local_15c0,local_15e0);
  cfd::core::Script::operator=(local_14f0,&local_15c0);
  cfd::core::Script::~Script
            ((Script *)CONCAT44(in_stack_ffffffffffffa944,in_stack_ffffffffffffa940));
  std::__cxx11::string::~string(local_15e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_15e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1780,"ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w",&local_1781)
  ;
  cfd::AddressFactory::GetAddress(local_1760);
  cfd::core::Address::operator=(local_1480,(Address *)local_1760);
  cfd::core::Address::~Address
            ((Address *)CONCAT44(in_stack_ffffffffffffa944,in_stack_ffffffffffffa940));
  std::__cxx11::string::~string(local_1780);
  std::allocator<char>::~allocator((allocator<char> *)&local_1781);
  std::__cxx11::string::operator=
            (local_1308,"wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)");
  cfd::core::Amount::Amount((Amount *)&local_1798,10000000);
  local_12e0 = local_1790;
  local_12e8 = local_1798;
  local_12d8 = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_17e0,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             &local_17e1);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_17c0,local_17e0);
  cfd::core::ConfidentialAssetId::operator=(local_12c8,&local_17c0);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x27c7f6);
  std::__cxx11::string::~string(local_17e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_17e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_19b8,
             "CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3ggeFikyDxDW5gU8WmTXtb2HWWjc23YXZz",
             &local_19b9);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(local_1998,local_19b8);
  std::__cxx11::string::~string(local_19b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_19b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1b90,
             "CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3VHXTF8dZAhKb1iBAnzYXEj527CSdfj2PS",
             (allocator *)(local_1ba8 + 0x17));
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(local_1b70,local_1b90);
  std::__cxx11::string::~string(local_1b90);
  std::allocator<char>::~allocator((allocator<char> *)(local_1ba8 + 0x17));
  cfd::core::Amount::Amount((Amount *)local_1ba8,10000);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_1c60,2,0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::AddInput((UtxoData *)local_1c60);
    }
  }
  else {
    testing::Message::Message(local_1c70);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x76,
               "Expected: txc.AddInput(utxo1) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_1c78,local_1c70);
    testing::internal::AssertHelper::~AssertHelper(&local_1c78);
    testing::Message::~Message((Message *)0x27d17b);
  }
  cfd::core::OutPoint::OutPoint(&local_1ca0,&local_ca0,local_c80);
  cfd::ConfidentialTransactionContext::AddTxIn(local_1c60);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x27d208);
  cfd::core::OutPoint::OutPoint((OutPoint *)(local_1cd8 + 0x10),&local_1518,local_14f8);
  cfd::ConfidentialTransactionContext::AddTxIn(local_1c60);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x27d24a);
  local_1cf8 = cfd::core::operator+((Amount *)&local_2c8,(Amount *)&local_12e8);
  local_1cf0 = extraout_DL;
  local_1ce8 = local_1cf8;
  local_1ce0 = extraout_DL;
  local_1d08 = (_func_int **)cfd::core::operator-((Amount *)&local_1ce8,(Amount *)local_1ba8);
  local_1d00 = extraout_DL_00;
  local_1cd8._0_8_ = local_1d08;
  local_1cd8[8] = extraout_DL_00;
  cfd::ConfidentialTransactionContext::AddTxOut
            ((ElementsConfidentialAddress *)local_1c60,(Amount *)local_1998,
             (ConfidentialAssetId *)local_1cd8,SUB81(local_2a8,0));
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress();
  cfd::ConfidentialTransactionContext::AddTxOut
            ((Address *)local_1c60,local_1e80,(ConfidentialAssetId *)local_a70);
  cfd::core::Address::~Address
            ((Address *)CONCAT44(in_stack_ffffffffffffa944,in_stack_ffffffffffffa940));
  cfd::core::ConfidentialTransaction::AddTxOutFee
            ((Amount *)local_1c60,(ConfidentialAssetId *)local_1ba8);
  local_2d80 = local_2d78;
  cfd::UtxoData::UtxoData(local_2d80,(UtxoData *)local_520);
  local_2d80 = local_2888;
  cfd::UtxoData::UtxoData(local_2d80,(UtxoData *)local_cc8);
  local_2d80 = local_2398;
  cfd::UtxoData::UtxoData(local_2d80,(UtxoData *)local_1540);
  local_1ea8 = local_2d78;
  local_1ea0 = 3;
  std::allocator<cfd::UtxoData>::allocator((allocator<cfd::UtxoData> *)0x27d430);
  __l._M_array._4_4_ = in_stack_ffffffffffffa97c;
  __l._M_array._0_4_ = in_stack_ffffffffffffa978;
  __l._M_len._0_4_ = in_stack_ffffffffffffa980;
  __l._M_len._4_4_ = in_stack_ffffffffffffa984;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (in_stack_ffffffffffffa970,__l,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffa96c,in_stack_ffffffffffffa968));
  std::allocator<cfd::UtxoData>::~allocator((allocator<cfd::UtxoData> *)0x27d464);
  local_54f8 = (UtxoData *)&local_1ea8;
  do {
    local_54f8 = local_54f8 + -0x4f0;
    cfd::UtxoData::~UtxoData
              ((UtxoData *)CONCAT44(in_stack_ffffffffffffa944,in_stack_ffffffffffffa940));
  } while (local_54f8 != local_2d78);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::CollectInputUtxo((vector *)local_1c60);
    }
  }
  else {
    testing::Message::Message(local_2d90);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x7e,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2d98,local_2d90);
    testing::internal::AssertHelper::~AssertHelper(&local_2d98);
    testing::Message::~Message((Message *)0x27d72f);
  }
  cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption(in_stack_ffffffffffffa950);
  cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption(in_stack_ffffffffffffa950);
  cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption(in_stack_ffffffffffffa950);
  cfd::UtxoData::operator=(local_32d0,(UtxoData *)local_520);
  cfd::UtxoData::operator=(local_3808,(UtxoData *)local_cc8);
  cfd::UtxoData::operator=((UtxoData *)(local_3d58 + 0x18),(UtxoData *)local_1540);
  local_4d18 = local_4d10;
  cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption
            (in_stack_ffffffffffffa960,in_stack_ffffffffffffa958);
  local_4d18 = (undefined8 **)local_47d8;
  cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption
            (in_stack_ffffffffffffa960,in_stack_ffffffffffffa958);
  local_4d18 = (undefined8 **)local_42a0;
  cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption
            (in_stack_ffffffffffffa960,in_stack_ffffffffffffa958);
  local_3d68 = local_4d10;
  local_3d60 = 3;
  std::allocator<cfd::api::ElementsUtxoAndOption>::allocator
            ((allocator<cfd::api::ElementsUtxoAndOption> *)0x27d87a);
  __l_00._M_array._4_4_ = in_stack_ffffffffffffa97c;
  __l_00._M_array._0_4_ = in_stack_ffffffffffffa978;
  __l_00._M_len._0_4_ = in_stack_ffffffffffffa980;
  __l_00._M_len._4_4_ = in_stack_ffffffffffffa984;
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
          *)in_stack_ffffffffffffa970,__l_00,
         (allocator_type *)CONCAT44(in_stack_ffffffffffffa96c,in_stack_ffffffffffffa968));
  std::allocator<cfd::api::ElementsUtxoAndOption>::~allocator
            ((allocator<cfd::api::ElementsUtxoAndOption> *)0x27d8ae);
  local_5548 = (undefined1 ***)&local_3d68;
  do {
    local_5548 = local_5548 + -0xa7;
    cfd::api::ElementsUtxoAndOption::~ElementsUtxoAndOption
              ((ElementsUtxoAndOption *)
               CONCAT44(in_stack_ffffffffffffa944,in_stack_ffffffffffffa940));
  } while (local_5548 != local_4d10);
  local_4d28 = 1.0;
  cfd::core::Amount::Amount((Amount *)&local_4d38);
  cfd::core::Amount::Amount(local_4d48);
  cfd::core::Amount::Amount(local_4d58);
  cfd::api::ElementsTransactionApi::ElementsTransactionApi(&local_4d59);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  this_00 = (vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
             *)0x0;
  uVar9 = 0x34;
  uVar8 = 0;
  uVar7 = 1;
  expected_predicate_value = local_4d48;
  local_4da0 = cfd::api::ElementsTransactionApi::EstimateFee
                         ((string *)&local_4d59,local_4d90,(ConfidentialAssetId *)local_3d58,
                          (Amount *)local_2a8,local_4d58,SUB81(expected_predicate_value,0),
                          local_4d28,1,0,(uint *)CONCAT44(in_stack_ffffffffffffa94c,0x34));
  local_4d98 = extraout_DL_01;
  local_4d70 = local_4da0;
  local_4d68 = extraout_DL_01;
  local_4d38 = local_4da0;
  local_4d30 = extraout_DL_01;
  std::__cxx11::string::~string((string *)local_4d90);
  local_4db8 = cfd::core::Amount::GetSatoshiValue();
  local_4dbc = 0xad2;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)in_stack_ffffffffffffa958,(char *)this_00,
             (long *)CONCAT44(in_stack_ffffffffffffa94c,uVar9),
             (int *)CONCAT44(in_stack_ffffffffffffa944,uVar8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4db0);
  if (!bVar1) {
    testing::Message::Message(&local_4dc8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x27dc74);
    testing::internal::AssertHelper::AssertHelper
              (&local_4dd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x92,pcVar4);
    testing::internal::AssertHelper::operator=(&local_4dd0,&local_4dc8);
    testing::internal::AssertHelper::~AssertHelper(&local_4dd0);
    testing::Message::~Message((Message *)0x27dcd7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x27dd2f);
  local_4de8 = cfd::core::Amount::GetSatoshiValue();
  local_4dec = 0x99a;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)in_stack_ffffffffffffa958,(char *)this_00,
             (long *)CONCAT44(in_stack_ffffffffffffa94c,uVar9),
             (int *)CONCAT44(in_stack_ffffffffffffa944,uVar8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4de0);
  if (!bVar1) {
    testing::Message::Message(&local_4df8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x27ddfd);
    testing::internal::AssertHelper::AssertHelper
              (&local_4e00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x93,pcVar4);
    testing::internal::AssertHelper::operator=(&local_4e00,&local_4df8);
    testing::internal::AssertHelper::~AssertHelper(&local_4e00);
    testing::Message::~Message((Message *)0x27de60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x27deb8);
  local_4e18 = cfd::core::Amount::GetSatoshiValue();
  local_4e1c = 0x138;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)in_stack_ffffffffffffa958,(char *)this_00,
             (long *)CONCAT44(in_stack_ffffffffffffa94c,uVar9),
             (int *)CONCAT44(in_stack_ffffffffffffa944,uVar8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4e10);
  if (!bVar1) {
    testing::Message::Message(&local_4e28);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x27df86);
    testing::internal::AssertHelper::AssertHelper
              (&local_4e30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x94,pcVar4);
    testing::internal::AssertHelper::operator=(&local_4e30,&local_4e28);
    testing::internal::AssertHelper::~AssertHelper(&local_4e30);
    testing::Message::~Message((Message *)0x27dfe9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x27e041);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::vector((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
            *)0x27e056);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
               *)this_00,(value_type *)CONCAT44(in_stack_ffffffffffffa94c,uVar9));
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      expected_predicate_value = (Amount *)0x0;
      cfd::ConfidentialTransactionContext::Blind
                ((vector *)local_1c60,(long)local_4e48,1,0,(vector *)0x34);
    }
  }
  else {
    testing::Message::Message(&local_4e50);
    testing::internal::AssertHelper::AssertHelper
              (&local_4e58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x98,
               "Expected: txc.Blind(&ct_addrs) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_4e58,&local_4e50);
    testing::internal::AssertHelper::~AssertHelper(&local_4e58);
    testing::Message::~Message((Message *)0x27e1a2);
  }
  cfd::core::ConfidentialTransaction::GetTxOutList();
  local_4e88 = std::
               vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
               ::size(local_4e70);
  local_4e8c = 3;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((char *)in_stack_ffffffffffffa958,(char *)this_00,
             (unsigned_long *)CONCAT44(in_stack_ffffffffffffa94c,uVar9),
             (int *)CONCAT44(in_stack_ffffffffffffa944,uVar8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4e80);
  if (!bVar1) {
    testing::Message::Message(&local_4e98);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x27e2c7);
    testing::internal::AssertHelper::AssertHelper
              (&local_4ea0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x9a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_4ea0,&local_4e98);
    testing::internal::AssertHelper::~AssertHelper(&local_4ea0);
    testing::Message::~Message((Message *)0x27e32a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x27e382);
  sVar5 = std::
          vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
          ::size(local_4e70);
  if (sVar5 == 3) {
    std::
    vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
    ::operator[](local_4e70,0);
    cfd::core::ConfidentialTxOutReference::GetConfidentialValue
              ((ConfidentialTxOutReference *)CONCAT44(in_stack_ffffffffffffa93c,uVar7));
    local_4eb1 = cfd::core::ConfidentialValue::HasBlinding();
    local_4eb1 = local_4eb1 & 1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_ffffffffffffa944,uVar8),
               (bool *)CONCAT44(in_stack_ffffffffffffa93c,uVar7),(type *)0x27e3fb);
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x27e40a);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4eb0);
    if (!bVar1) {
      testing::Message::Message(local_4ee8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_4f10,(internal *)&local_4eb0,
                 (AssertionResult *)"txouts[0].GetConfidentialValue().HasBlinding()","false","true",
                 (char *)expected_predicate_value);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_4ef0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x9c,pcVar4);
      testing::internal::AssertHelper::operator=(&local_4ef0,local_4ee8);
      testing::internal::AssertHelper::~AssertHelper(&local_4ef0);
      std::__cxx11::string::~string((string *)&local_4f10);
      testing::Message::~Message((Message *)0x27e52c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x27e5a7);
    std::
    vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
    ::operator[](local_4e70,1);
    cfd::core::ConfidentialTxOutReference::GetConfidentialValue
              ((ConfidentialTxOutReference *)CONCAT44(in_stack_ffffffffffffa93c,uVar7));
    local_4f21 = cfd::core::ConfidentialValue::HasBlinding();
    local_4f21 = local_4f21 & 1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_ffffffffffffa944,uVar8),
               (bool *)CONCAT44(in_stack_ffffffffffffa93c,uVar7),(type *)0x27e60a);
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x27e619);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4f20);
    if (!bVar1) {
      testing::Message::Message(local_4f58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_4f80,(internal *)&local_4f20,
                 (AssertionResult *)"txouts[1].GetConfidentialValue().HasBlinding()","false","true",
                 (char *)expected_predicate_value);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_4f60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x9d,pcVar4);
      testing::internal::AssertHelper::operator=(&local_4f60,local_4f58);
      testing::internal::AssertHelper::~AssertHelper(&local_4f60);
      std::__cxx11::string::~string((string *)&local_4f80);
      testing::Message::~Message((Message *)0x27e73b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x27e7b6);
    std::
    vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
    ::operator[](local_4e70,2);
    cfd::core::ConfidentialTxOutReference::GetConfidentialValue
              ((ConfidentialTxOutReference *)CONCAT44(in_stack_ffffffffffffa93c,uVar7));
    bVar2 = cfd::core::ConfidentialValue::HasBlinding();
    local_4f91 = ~bVar2 & 1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_ffffffffffffa944,uVar8),
               (bool *)CONCAT44(in_stack_ffffffffffffa93c,uVar7),(type *)0x27e81b);
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x27e82a);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4f90);
    if (!bVar1) {
      testing::Message::Message(local_4fc8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_4ff0,(internal *)&local_4f90,
                 (AssertionResult *)"txouts[2].GetConfidentialValue().HasBlinding()","true","false",
                 (char *)expected_predicate_value);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_4fd0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x9e,pcVar4);
      testing::internal::AssertHelper::operator=(&local_4fd0,local_4fc8);
      testing::internal::AssertHelper::~AssertHelper(&local_4fd0);
      std::__cxx11::string::~string((string *)&local_4ff0);
      testing::Message::~Message((Message *)0x27e94c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x27e9c4);
  }
  cfd::core::ByteData::ByteData(&local_5008);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_5030,&local_4f8,local_4d8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_5068,"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",
                 &local_5069);
      cfd::core::Pubkey::Pubkey(&local_5048,local_5068);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_50b0,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",&local_50b1);
      cfd::core::Privkey::FromWif(local_5090,(NetType)local_50b0,true);
      cfd::core::SigHashType::SigHashType(local_50c0);
      cfd::ConfidentialTransactionContext::SignWithKey
                (local_1c60,&local_5030,&local_5048,local_5090,local_50c0,1);
      cfd::core::Privkey::~Privkey((Privkey *)0x27eb2d);
      std::__cxx11::string::~string(local_50b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_50b1);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x27eb54);
      std::__cxx11::string::~string(local_5068);
      std::allocator<char>::~allocator((allocator<char> *)&local_5069);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x27eb7b);
    }
  }
  else {
    testing::Message::Message(&local_50c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_50d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0xa6,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_50d0,&local_50c8);
    testing::internal::AssertHelper::~AssertHelper(&local_50d0);
    testing::Message::~Message((Message *)0x27ed0d);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_50f8,&local_4f8,local_4d8);
      cfd::ConfidentialTransactionContext::Verify(local_1c60);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x27edd6);
    }
  }
  else {
    testing::Message::Message(&local_5100);
    testing::internal::AssertHelper::AssertHelper
              (&local_5108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0xa7,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_5108,&local_5100);
    testing::internal::AssertHelper::~AssertHelper(&local_5108);
    testing::Message::~Message((Message *)0x27eea0);
  }
  testing::internal::ConstCharPtr::ConstCharPtr(&local_5110,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_5110);
  if (bVar1) {
    local_5111 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::Finalize();
      cfd::core::ByteData::operator=
                ((ByteData *)CONCAT44(in_stack_ffffffffffffa944,uVar8),
                 (ByteData *)CONCAT44(in_stack_ffffffffffffa93c,uVar7));
      cfd::core::ByteData::~ByteData((ByteData *)0x27ef86);
    }
    if ((local_5111 & 1) == 0) {
      local_5110.value =
           "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_0027f029;
    }
  }
  else {
LAB_0027f029:
    testing::Message::Message(local_5140);
    testing::internal::AssertHelper::AssertHelper
              (&local_5148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0xa9,local_5110.value);
    testing::internal::AssertHelper::operator=(&local_5148,local_5140);
    testing::internal::AssertHelper::~AssertHelper(&local_5148);
    testing::Message::~Message((Message *)0x27f091);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_5170,&local_ca0,local_c80);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_51a8,"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27",
                 &local_51a9);
      cfd::core::Pubkey::Pubkey(&local_5188,local_51a8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_51f0,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP",&local_51f1);
      cfd::core::Privkey::FromWif(local_51d0,(NetType)local_51f0,true);
      cfd::core::SigHashType::SigHashType(local_5200);
      cfd::ConfidentialTransactionContext::SignWithKey
                (local_1c60,&local_5170,&local_5188,local_51d0,local_5200,1);
      cfd::core::Privkey::~Privkey((Privkey *)0x27f222);
      std::__cxx11::string::~string(local_51f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_51f1);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x27f249);
      std::__cxx11::string::~string(local_51a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_51a9);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x27f270);
    }
  }
  else {
    testing::Message::Message(&local_5208);
    testing::internal::AssertHelper::AssertHelper
              (&local_5210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0xae,
               "Expected: txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout), Pubkey(\"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27\"), Privkey::FromWif( \"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_5210,&local_5208);
    testing::internal::AssertHelper::~AssertHelper(&local_5210);
    testing::Message::~Message((Message *)0x27f3e9);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_5238,&local_ca0,local_c80);
      cfd::ConfidentialTransactionContext::Verify(local_1c60);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x27f4b2);
    }
  }
  else {
    testing::Message::Message(&local_5240);
    testing::internal::AssertHelper::AssertHelper
              (&local_5248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0xaf,
               "Expected: txc.Verify(OutPoint(utxo2.txid, utxo2.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_5248,&local_5240);
    testing::internal::AssertHelper::~AssertHelper(&local_5248);
    testing::Message::~Message((Message *)0x27f57c);
  }
  testing::internal::ConstCharPtr::ConstCharPtr(&local_5250,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_5250);
  if (bVar1) {
    local_5251 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::Finalize();
      cfd::core::ByteData::operator=
                ((ByteData *)CONCAT44(in_stack_ffffffffffffa944,uVar8),
                 (ByteData *)CONCAT44(in_stack_ffffffffffffa93c,uVar7));
      cfd::core::ByteData::~ByteData((ByteData *)0x27f662);
    }
    if ((local_5251 & 1) != 0) goto LAB_0027f7b8;
    local_5250.value =
         "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_5280);
  testing::internal::AssertHelper::AssertHelper
            (&local_5288,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
             ,0xb1,local_5250.value);
  testing::internal::AssertHelper::operator=(&local_5288,local_5280);
  testing::internal::AssertHelper::~AssertHelper(&local_5288);
  testing::Message::~Message((Message *)0x27f76d);
LAB_0027f7b8:
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_52b0,&local_1518,local_14f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_52e8,"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",
                 &local_52e9);
      cfd::core::Pubkey::Pubkey(&local_52c8,local_52e8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_5330,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",&local_5331);
      cfd::core::Privkey::FromWif(local_5310,(NetType)local_5330,true);
      cfd::core::SigHashType::SigHashType(local_5340);
      cfd::ConfidentialTransactionContext::SignWithKey
                (local_1c60,&local_52b0,&local_52c8,local_5310,local_5340,1);
      cfd::core::Privkey::~Privkey((Privkey *)0x27f8fe);
      std::__cxx11::string::~string(local_5330);
      std::allocator<char>::~allocator((allocator<char> *)&local_5331);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x27f925);
      std::__cxx11::string::~string(local_52e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_52e9);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x27f94c);
    }
  }
  else {
    testing::Message::Message(&local_5348);
    testing::internal::AssertHelper::AssertHelper
              (&local_5350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0xb6,
               "Expected: txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_5350,&local_5348);
    testing::internal::AssertHelper::~AssertHelper(&local_5350);
    testing::Message::~Message((Message *)0x27fac5);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_5378,&local_1518,local_14f8);
      cfd::ConfidentialTransactionContext::Verify(local_1c60);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x27fb8e);
    }
  }
  else {
    testing::Message::Message(&local_5380);
    testing::internal::AssertHelper::AssertHelper
              (&local_5388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0xb7,
               "Expected: txc.Verify(OutPoint(utxo3.txid, utxo3.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_5388,&local_5380);
    testing::internal::AssertHelper::~AssertHelper(&local_5388);
    testing::Message::~Message((Message *)0x27fc58);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::Finalize();
      cfd::core::ByteData::operator=
                ((ByteData *)CONCAT44(in_stack_ffffffffffffa944,uVar8),
                 (ByteData *)CONCAT44(in_stack_ffffffffffffa93c,uVar7));
      cfd::core::ByteData::~ByteData((ByteData *)0x27fd15);
    }
  }
  else {
    testing::Message::Message(local_53a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_53b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0xb9,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_53b0,local_53a8);
    testing::internal::AssertHelper::~AssertHelper(&local_53b0);
    testing::Message::~Message((Message *)0x27fdbc);
  }
  lVar6 = cfd::core::ByteData::GetDataSize();
  if ((((lVar6 != 0x24b7) && (lVar6 = cfd::core::ByteData::GetDataSize(), lVar6 != 0x24b8)) &&
      (lVar6 = cfd::core::ByteData::GetDataSize(), lVar6 != 0x24b9)) &&
     (lVar6 = cfd::core::ByteData::GetDataSize(), lVar6 != 0x24ba)) {
    local_53c8 = cfd::core::ByteData::GetDataSize();
    local_53cc = 0;
    testing::internal::EqHelper<false>::Compare<unsigned_long,int>
              ((char *)in_stack_ffffffffffffa958,(char *)this_00,
               (unsigned_long *)CONCAT44(in_stack_ffffffffffffa94c,uVar9),
               (int *)CONCAT44(in_stack_ffffffffffffa944,uVar8));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_53c0);
    if (!bVar1) {
      testing::Message::Message(&local_53d8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x27ff51);
      testing::internal::AssertHelper::AssertHelper
                (&local_53e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0xbd,pcVar4);
      testing::internal::AssertHelper::operator=(&local_53e0,&local_53d8);
      testing::internal::AssertHelper::~AssertHelper(&local_53e0);
      testing::Message::~Message((Message *)0x27ffae);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x280003);
  }
  iVar3 = cfd::core::ConfidentialTransaction::GetVsize();
  if ((iVar3 != 0xad0) && (iVar3 = cfd::core::ConfidentialTransaction::GetVsize(), iVar3 != 0xacf))
  {
    local_53f4 = cfd::core::ConfidentialTransaction::GetVsize();
    local_53f8 = 0xad0;
    testing::internal::EqHelper<false>::Compare<unsigned_int,int>
              ((char *)in_stack_ffffffffffffa958,(char *)this_00,
               (uint *)CONCAT44(in_stack_ffffffffffffa94c,uVar9),
               (int *)CONCAT44(in_stack_ffffffffffffa944,uVar8));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_53f0);
    if (!bVar1) {
      testing::Message::Message(&local_5400);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x280108);
      testing::internal::AssertHelper::AssertHelper
                (&local_5408,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0xc1,pcVar4);
      testing::internal::AssertHelper::operator=(&local_5408,&local_5400);
      testing::internal::AssertHelper::~AssertHelper(&local_5408);
      testing::Message::~Message((Message *)0x280165);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2801ba);
  }
  local_540c = cfd::core::ConfidentialTransaction::GetVsize();
  local_540c = local_540c * (int)(long)local_4d28;
  if ((local_540c != 0xad0) && (local_540c != 0xacf)) {
    local_5424 = 0xad0;
    testing::internal::EqHelper<false>::Compare<unsigned_int,int>
              ((char *)in_stack_ffffffffffffa958,(char *)this_00,
               (uint *)CONCAT44(in_stack_ffffffffffffa94c,uVar9),
               (int *)CONCAT44(in_stack_ffffffffffffa944,uVar8));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5420);
    if (!bVar1) {
      testing::Message::Message(&local_5430);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x2802aa);
      testing::internal::AssertHelper::AssertHelper
                (&local_5438,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0xc6,pcVar4);
      testing::internal::AssertHelper::operator=(&local_5438,&local_5430);
      testing::internal::AssertHelper::~AssertHelper(&local_5438);
      testing::Message::~Message((Message *)0x280307);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x28035c);
  }
  cfd::core::ByteData::~ByteData((ByteData *)0x28037d);
  std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::~vector(this_00);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::~vector((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
             *)this_00);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
           *)this_00);
  cfd::api::ElementsUtxoAndOption::~ElementsUtxoAndOption
            ((ElementsUtxoAndOption *)CONCAT44(in_stack_ffffffffffffa944,uVar8));
  cfd::api::ElementsUtxoAndOption::~ElementsUtxoAndOption
            ((ElementsUtxoAndOption *)CONCAT44(in_stack_ffffffffffffa944,uVar8));
  cfd::api::ElementsUtxoAndOption::~ElementsUtxoAndOption
            ((ElementsUtxoAndOption *)CONCAT44(in_stack_ffffffffffffa944,uVar8));
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)this_00);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)CONCAT44(in_stack_ffffffffffffa944,uVar8));
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)CONCAT44(in_stack_ffffffffffffa944,uVar8));
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)CONCAT44(in_stack_ffffffffffffa944,uVar8));
  cfd::UtxoData::~UtxoData((UtxoData *)CONCAT44(in_stack_ffffffffffffa944,uVar8));
  cfd::UtxoData::~UtxoData((UtxoData *)CONCAT44(in_stack_ffffffffffffa944,uVar8));
  cfd::UtxoData::~UtxoData((UtxoData *)CONCAT44(in_stack_ffffffffffffa944,uVar8));
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x280433);
  return;
}

Assistant:

TEST(ElementsTransactionApi, EstimateFee_CheckRealValue)
{
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph");
  utxo1.descriptor = "pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo1.amount = Amount(int64_t{10000000});
  utxo1.address_type = AddressType::kP2pkhAddress;
  utxo1.asset = ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  // utxo1.asset_blind_factor = BlindFactor("");
  // utxo1.amount_blind_factor = BlindFactor("");
  // utxo1.value_commitment = ConfidentialValue("");

  // Address2 (pattern-x1)
  // pubkey: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  // blinding key: '66e4df5035a64acef16b4aa52ddc8bebd22b22c9eca150774e355abc72909d83'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 0;
  utxo2.locking_script = Script("a9145d54db96a28f844a744e393fcd699d6f825b284187");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE");
  utxo2.descriptor = "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))";
  utxo2.amount = Amount(int64_t{180000});
  utxo2.address_type = AddressType::kP2shP2wpkhAddress;
  utxo2.asset = ConfidentialAssetId("849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735");
  // utxo2.confidential_address;
  utxo2.asset_blind_factor = BlindFactor("23b44363de1069842dff58ac6c965f75af71949e58d823d7bfcc963134db0b3e");
  utxo2.amount_blind_factor = BlindFactor("6dfe8c49f10c40cac178da4056dbf55eb11fa26e3169f41019e88252d86c42bc");
  utxo2.value_commitment = ConfidentialValue("09da970d871982c2405b2d4bff4f455e4907bedaf95c205f94015809f6bd9c59fa");

  // Address3
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo3.vout = 1;
  utxo3.locking_script = Script("0014f330ed8383f8afdc977dd88600eb8ff120ba15e4");
  // utxo1.redeem_script = Script("");
  utxo3.address = factory.GetAddress("ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w");
  utxo3.descriptor = "wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo3.amount = Amount(int64_t{10000000});
  utxo3.address_type = AddressType::kP2wpkhAddress;
  utxo3.asset = ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  ElementsConfidentialAddress address("CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3ggeFikyDxDW5gU8WmTXtb2HWWjc23YXZz");
  // "2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z"
  ElementsConfidentialAddress asset_address("CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3VHXTF8dZAhKb1iBAnzYXEj527CSdfj2PS");

  Amount fee(int64_t{10000});
  ConfidentialTransactionContext txc(2, 0);
  EXPECT_NO_THROW(txc.AddInput(utxo1));
  txc.AddTxIn(OutPoint(utxo2.txid, utxo2.vout));
  txc.AddTxIn(OutPoint(utxo3.txid, utxo3.vout));
  txc.AddTxOut(address, utxo1.amount + utxo3.amount - fee, utxo1.asset);
  txc.AddTxOut(asset_address.GetUnblindedAddress(), utxo2.amount, utxo2.asset);
  txc.AddTxOutFee(fee, utxo1.asset);

  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};
  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  ElementsUtxoAndOption eutxo1;
  ElementsUtxoAndOption eutxo2;
  ElementsUtxoAndOption eutxo3;
  eutxo1.utxo = utxo1;
  eutxo2.utxo = utxo2;
  eutxo3.utxo = utxo3;
  std::vector<cfd::api::ElementsUtxoAndOption> utxos_and_options{
      eutxo1, eutxo2, eutxo3
  };

  // check estimateFee
  double effective_fee_rate = 1.0;
  Amount calc_fee;
  Amount utxo_fee;
  Amount tx_fee;
  ElementsTransactionApi api;
  calc_fee = api.EstimateFee(txc.GetHex(), utxos_and_options, utxo1.asset,
      &tx_fee, &utxo_fee, true, effective_fee_rate);
  EXPECT_EQ(calc_fee.GetSatoshiValue(), 2770);
  EXPECT_EQ(tx_fee.GetSatoshiValue(), 2458);
  EXPECT_EQ(utxo_fee.GetSatoshiValue(), 312);

  std::vector<cfd::core::ElementsConfidentialAddress> ct_addrs;
  ct_addrs.push_back(asset_address);
  EXPECT_NO_THROW(txc.Blind(&ct_addrs));
  std::vector<ConfidentialTxOutReference> txouts = txc.GetTxOutList();
  EXPECT_EQ(txouts.size(), 3);
  if (txouts.size() == 3) {
    EXPECT_TRUE(txouts[0].GetConfidentialValue().HasBlinding());
    EXPECT_TRUE(txouts[1].GetConfidentialValue().HasBlinding());
    EXPECT_FALSE(txouts[2].GetConfidentialValue().HasBlinding());
  }

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));

  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout),
      Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
      Privkey::FromWif(
          "cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo2.txid, utxo2.vout)));

  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo3.txid, utxo3.vout)));

  EXPECT_NO_THROW(tx = txc.Finalize());

  if ((tx.GetDataSize() != 9399) && (tx.GetDataSize() != 9400) &&
      (tx.GetDataSize() != 9401) && (tx.GetDataSize() != 9402)) {
    EXPECT_EQ(tx.GetDataSize(), 0);
  }

  if ((txc.GetVsize() != 2768) && (txc.GetVsize() != 2767)) {
    EXPECT_EQ(txc.GetVsize(), 2768);
  }

  uint32_t minimum_fee = txc.GetVsize() * static_cast<uint32_t>(effective_fee_rate);
  if ((minimum_fee != 2768) && (minimum_fee != 2767)) {
    EXPECT_EQ(minimum_fee, 2768);
  }
  // EXPECT_STREQ(tx.GetHex().c_str(), "");
}